

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIso.c
# Opt level: O0

Aig_Man_t * Saig_ManIsoReduce(Aig_Man_t *pAig,Vec_Ptr_t **pvPosEquivs,int fVerbose)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  abctime aVar5;
  Aig_Man_t *p;
  abctime aVar6;
  abctime clk;
  Aig_Man_t *pPart;
  int fVerbose_local;
  Vec_Ptr_t **pvPosEquivs_local;
  Aig_Man_t *pAig_local;
  
  aVar5 = Abc_Clock();
  p = Iso_ManFilterPos(pAig,pvPosEquivs,fVerbose);
  uVar1 = Saig_ManPoNum(pAig);
  uVar2 = Saig_ManPoNum(p);
  printf("Reduced %d outputs to %d outputs.  ",(ulong)uVar1,(ulong)uVar2);
  aVar6 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar6 - aVar5);
  if ((fVerbose != 0) && (*pvPosEquivs != (Vec_Ptr_t *)0x0)) {
    iVar3 = Saig_ManPoNum(pAig);
    iVar4 = Vec_PtrSize(*pvPosEquivs);
    if (iVar3 != iVar4) {
      printf("Nontrivial classes:\n");
      Vec_VecPrintInt((Vec_Vec_t *)*pvPosEquivs,1);
    }
  }
  return p;
}

Assistant:

Aig_Man_t * Saig_ManIsoReduce( Aig_Man_t * pAig, Vec_Ptr_t ** pvPosEquivs, int fVerbose )
{ 
    Aig_Man_t * pPart;
    abctime clk = Abc_Clock();
    pPart = Iso_ManFilterPos( pAig, pvPosEquivs, fVerbose );
    printf( "Reduced %d outputs to %d outputs.  ", Saig_ManPoNum(pAig), Saig_ManPoNum(pPart) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    if ( fVerbose && *pvPosEquivs && Saig_ManPoNum(pAig) != Vec_PtrSize(*pvPosEquivs) )
    {
        printf( "Nontrivial classes:\n" );
        Vec_VecPrintInt( (Vec_Vec_t *)*pvPosEquivs, 1 );
    }
//    Aig_ManStopP( &pPart );
    return pPart;
}